

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDataSource.h
# Opt level: O2

uint32_t __thiscall libssio::FileDataSource::read4big(FileDataSource *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  iVar1 = fgetc((FILE *)this->f);
  uVar2 = fgetc((FILE *)this->f);
  uVar3 = fgetc((FILE *)this->f);
  uVar4 = fgetc((FILE *)this->f);
  return iVar1 << 0x18 | (uVar2 & 0xff) << 0x10 | (uVar3 & 0xff) << 8 | uVar4 & 0xff;
}

Assistant:

uint32_t read4big() override
    {
        unsigned char b0, b1, b2, b3;
        b3 = fgetc(f);
        b2 = fgetc(f);
        b1 = fgetc(f);
        b0 = fgetc(f);
        return (b0 | (b1<<8) | (b2<<16) | (b3<<24));
    }